

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O2

Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
* __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
::multiply_source_and_add
          (Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
           *this,Vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                 *column,Field_element *val)

{
  ID_index IVar1;
  Dimension DVar2;
  bool bVar3;
  
  if (*val == true) {
    bVar3 = Vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
            ::
            _add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>
                      ((Vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
                        *)this,column);
    if (bVar3) {
      IVar1 = (this->super_Chain_column_option).pivot_;
      (this->super_Chain_column_option).pivot_ = (column->super_Chain_column_option).pivot_;
      (column->super_Chain_column_option).pivot_ = IVar1;
      DVar2 = (this->super_Column_dimension_option).dim_;
      (this->super_Column_dimension_option).dim_ = (column->super_Column_dimension_option).dim_;
      (column->super_Column_dimension_option).dim_ = DVar2;
    }
  }
  return this;
}

Assistant:

inline Vector_column<Master_matrix>& Vector_column<Master_matrix>::multiply_source_and_add(Vector_column& column,
                                                                                           const Field_element& val)
{
  if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
    // assumes that the addition never zeros out this column.
    if constexpr (Master_matrix::Option_list::is_z2) {
      if (val) {
        if (_add(column)) {
          Chain_opt::swap_pivots(column);
          Dim_opt::swap_dimension(column);
        }
      }
    } else {
      if (_multiply_source_and_add(column, val)) {
        Chain_opt::swap_pivots(column);
        Dim_opt::swap_dimension(column);
      }
    }
  } else {
    if constexpr (Master_matrix::Option_list::is_z2) {
      if (val) {
        _add(column);
      }
    } else {
      _multiply_source_and_add(column, val);
    }
  }

  return *this;
}